

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::trun::parse(trun *this,char *ptr)

{
  bool bVar1;
  uint32_t uVar2;
  undefined1 local_a8 [8];
  sample_entry ent;
  uint i;
  uint offset;
  reference local_70;
  reference local_60;
  reference local_50;
  reference local_40;
  reference local_30;
  bitset<32UL> local_20;
  bitset<32UL> bb;
  char *ptr_local;
  trun *this_local;
  
  bb.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(_Base_bitset<1UL>)ptr;
  full_box::parse(&this->super_full_box,ptr);
  uVar2 = anon_unknown.dwarf_15def::fmp4_read_uint32
                    ((char *)((long)bb.super__Base_bitset<1UL>._M_w + 0xc));
  *(uint32_t *)&(this->super_full_box).field_0x6c = uVar2;
  std::bitset<32UL>::bitset(&local_20,(ulong)*(uint *)&(this->super_full_box).super_box.field_0x64);
  std::bitset<32UL>::operator[]((bitset<32UL> *)&local_30,(size_t)&local_20);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_30);
  this->data_offset_present_ = bVar1;
  std::bitset<32UL>::reference::~reference(&local_30);
  std::bitset<32UL>::operator[]((bitset<32UL> *)&local_40,(size_t)&local_20);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_40);
  this->first_sample_flags_present_ = bVar1;
  std::bitset<32UL>::reference::~reference(&local_40);
  std::bitset<32UL>::operator[]((bitset<32UL> *)&local_50,(size_t)&local_20);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_50);
  this->sample_duration_present_ = bVar1;
  std::bitset<32UL>::reference::~reference(&local_50);
  std::bitset<32UL>::operator[]((bitset<32UL> *)&local_60,(size_t)&local_20);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_60);
  this->sample_size_present_ = bVar1;
  std::bitset<32UL>::reference::~reference(&local_60);
  std::bitset<32UL>::operator[]((bitset<32UL> *)&local_70,(size_t)&local_20);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&local_70);
  this->sample_flags_present_ = bVar1;
  std::bitset<32UL>::reference::~reference(&local_70);
  std::bitset<32UL>::operator[]((bitset<32UL> *)&i,(size_t)&local_20);
  bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)&i);
  this->sample_composition_time_offsets_present_ = bVar1;
  std::bitset<32UL>::reference::~reference((reference *)&i);
  ent._28_4_ = 0x10;
  if ((this->data_offset_present_ & 1U) != 0) {
    uVar2 = anon_unknown.dwarf_15def::fmp4_read_uint32
                      ((char *)((long)bb.super__Base_bitset<1UL>._M_w + 0x10));
    this->data_offset_ = uVar2;
    ent._28_4_ = ent._28_4_ + 4;
  }
  if ((this->first_sample_flags_present_ & 1U) != 0) {
    uVar2 = anon_unknown.dwarf_15def::fmp4_read_uint32
                      ((char *)((long)bb.super__Base_bitset<1UL>._M_w + (ulong)(uint)ent._28_4_));
    this->first_sample_flags_ = uVar2;
    ent._28_4_ = ent._28_4_ + 4;
  }
  for (ent.sample_composition_time_offset_v1_ = 0;
      (uint)ent.sample_composition_time_offset_v1_ < *(uint *)&(this->super_full_box).field_0x6c;
      ent.sample_composition_time_offset_v1_ = ent.sample_composition_time_offset_v1_ + 1) {
    sample_entry::sample_entry((sample_entry *)local_a8);
    if ((this->sample_duration_present_ & 1U) != 0) {
      ent._vptr_sample_entry._0_4_ =
           anon_unknown.dwarf_15def::fmp4_read_uint32
                     ((char *)((long)bb.super__Base_bitset<1UL>._M_w + (ulong)(uint)ent._28_4_));
      ent._28_4_ = ent._28_4_ + 4;
    }
    if ((this->sample_size_present_ & 1U) != 0) {
      ent._vptr_sample_entry._4_4_ =
           anon_unknown.dwarf_15def::fmp4_read_uint32
                     ((char *)((long)bb.super__Base_bitset<1UL>._M_w + (ulong)(uint)ent._28_4_));
      ent._28_4_ = ent._28_4_ + 4;
    }
    if ((this->sample_flags_present_ & 1U) != 0) {
      ent.sample_duration_ =
           anon_unknown.dwarf_15def::fmp4_read_uint32
                     ((char *)((long)bb.super__Base_bitset<1UL>._M_w + (ulong)(uint)ent._28_4_));
      ent._28_4_ = ent._28_4_ + 4;
    }
    if ((this->sample_composition_time_offsets_present_ & 1U) != 0) {
      if ((this->super_full_box).super_box.field_0x62 == '\0') {
        ent.sample_size_ =
             anon_unknown.dwarf_15def::fmp4_read_uint32
                       ((char *)((long)bb.super__Base_bitset<1UL>._M_w + (ulong)(uint)ent._28_4_));
      }
      else {
        ent.sample_flags_ =
             anon_unknown.dwarf_15def::fmp4_read_uint32
                       ((char *)((long)bb.super__Base_bitset<1UL>._M_w + (ulong)(uint)ent._28_4_));
      }
      ent._28_4_ = ent._28_4_ + 4;
    }
    std::vector<fmp4_stream::trun::sample_entry,_std::allocator<fmp4_stream::trun::sample_entry>_>::
    push_back(&this->m_sentry,(value_type *)local_a8);
  }
  return;
}

Assistant:

void trun::parse(const char * ptr)
	{
		full_box::parse(ptr);

		sample_count_ = fmp4_read_uint32(ptr + 12);

		std::bitset<32> bb(flags_);

		data_offset_present_ = bb[0];
		//cout << "data_offset_present " << data_offset_present << endl;
		first_sample_flags_present_ = bb[2];
		//cout << "first_sample_flags_present " << first_sample_flags_present << endl;
		sample_duration_present_ = bb[8];
		//cout << "sample_duration_present " << sample_duration_present << endl;
		sample_size_present_ = bb[9];
		//cout << "sample_size_present " << sample_size_present << endl;
		sample_flags_present_ = bb[10];
		sample_composition_time_offsets_present_ = bb[11];

		//sentry.resize(sample_count);
		unsigned int offset = 16;
		if (data_offset_present_)
		{
			this->data_offset_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}if (first_sample_flags_present_) {
			this->first_sample_flags_ = fmp4_read_uint32(ptr + offset);
			offset += 4;
		}
		// write all the entries to the trun box
		for (unsigned int i = 0; i < sample_count_; i++)
		{
			sample_entry ent = {};
			if (sample_duration_present_)
			{
				ent.sample_duration_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			if (sample_size_present_)
			{
				ent.sample_size_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			if (sample_flags_present_)
			{
				ent.sample_flags_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			if (sample_composition_time_offsets_present_)
			{
				if (version_ == 0)
					ent.sample_composition_time_offset_v0_ = fmp4_read_uint32(ptr + offset);
				else
					ent.sample_composition_time_offset_v1_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
			}
			m_sentry.push_back(ent);
		}
	}